

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkIsAcyclicWithBoxes(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  Abc_Ntk_t *pAVar2;
  long *plVar3;
  FILE *__stream;
  int iVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  int iVar8;
  Abc_Obj_t *pNode;
  int iVar9;
  long lVar10;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar4 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar4 + 500;
    iVar9 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar9) {
      piVar5 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) goto LAB_0084a57f;
      (pNtk->vTravIds).nCap = iVar9;
      in_RDX = extraout_RDX;
    }
    else {
      piVar5 = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(piVar5,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar9;
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) goto LAB_0084a560;
    if (piVar5 == (int *)0x0) {
      iVar9 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar9 + 500;
      iVar8 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar8) {
        piVar5 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar5;
        if (piVar5 == (int *)0x0) {
LAB_0084a57f:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar8;
        in_RDX = extraout_RDX_01;
      }
      else {
        piVar5 = (int *)0x0;
      }
      if (-500 < iVar9) {
        memset(piVar5,0,(uVar1 & 0xffffffff) << 2);
        in_RDX = extraout_RDX_02;
      }
      (pNtk->vTravIds).nSize = iVar8;
    }
  }
  else {
    iVar4 = pNtk->nTravIds;
    pNtk->nTravIds = iVar4 + 1;
    if (0x3ffffffe < iVar4) goto LAB_0084a560;
  }
  pNtk->nTravIds = iVar4 + 2;
  if (iVar4 != 0x3ffffffe) {
    pVVar6 = pNtk->vPos;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        pNode = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*pVVar6->pArray[lVar10] + 0x20) + 8) +
                 (long)**(int **)((long)pVVar6->pArray[lVar10] + 0x20) * 8);
        if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        if ((*(uint *)&pNode->field_0x14 & 0xf) == 5) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        pAVar2 = pNode->pNtk;
        iVar4 = pNode->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,(int)in_RDX);
        if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) goto LAB_0084a541;
        in_RDX = extraout_RDX_03;
        if (((pAVar2->vTravIds).pArray[iVar4] != pNode->pNtk->nTravIds + -1) &&
           (iVar4 = Abc_NtkIsAcyclicWithBoxes_rec(pNode), in_RDX = extraout_RDX_04, iVar4 == 0))
        goto LAB_0084a4f5;
        lVar10 = lVar10 + 1;
        pVVar6 = pNtk->vPos;
      } while (lVar10 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vBoxes;
    if (pVVar6->nSize < 1) {
      return 1;
    }
    lVar10 = 0;
    do {
      plVar3 = (long *)pVVar6->pArray[lVar10];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        pNode = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        if ((*(uint *)&pNode->field_0x14 & 0xf) == 5) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        pAVar2 = pNode->pNtk;
        iVar4 = pNode->Id;
        Vec_IntFillExtra(&pAVar2->vTravIds,iVar4 + 1,(int)in_RDX);
        if (((long)iVar4 < 0) || ((pAVar2->vTravIds).nSize <= iVar4)) {
LAB_0084a541:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        in_RDX = extraout_RDX_05;
        if (((pAVar2->vTravIds).pArray[iVar4] != pNode->pNtk->nTravIds + -1) &&
           (iVar4 = Abc_NtkIsAcyclicWithBoxes_rec(pNode), in_RDX = extraout_RDX_06, iVar4 == 0)) {
LAB_0084a4f5:
          __stream = _stdout;
          pcVar7 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          fprintf(__stream," PO \"%s\"\n",pcVar7);
          return 0;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar6 = pNtk->vBoxes;
      if (pVVar6->nSize <= lVar10) {
        return 1;
      }
    } while( true );
  }
LAB_0084a560:
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclicWithBoxes( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int fAcyclic;
    int i;
    // set the traversal ID for this DFS ordering
    Abc_NtkIncrementTravId( pNtk );   
    Abc_NtkIncrementTravId( pNtk );   
    // pNode->TravId == pNet->nTravIds      means "pNode is on the path"
    // pNode->TravId == pNet->nTravIds - 1  means "pNode is visited but is not on the path"
    // pNode->TravId <  pNet->nTravIds - 1  means "pNode is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
        if ( Abc_ObjIsBo(pNode) )
            pNode = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdPrevious(pNode) )
            continue;
        // traverse the output logic cone
        if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        break;
    }
    if ( fAcyclic )
    {
        Abc_NtkForEachLatchInput( pNtk, pNode, i )
        {
            pNode = Abc_ObjFanin0Ntk(Abc_ObjFanin0(pNode));
            if ( Abc_ObjIsBo(pNode) )
                pNode = Abc_ObjFanin0(pNode);
            if ( Abc_NodeIsTravIdPrevious(pNode) )
                continue;
            // traverse the output logic cone
            if ( (fAcyclic = Abc_NtkIsAcyclicWithBoxes_rec(pNode)) )
                continue;
            // stop as soon as the first loop is detected
            fprintf( stdout, " PO \"%s\"\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            break;
        }
    }
    return fAcyclic;
}